

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

void __thiscall QRegion::QRegion(QRegion *this,QPolygon *a,FillRule fillRule)

{
  ulong uVar1;
  QRegionPrivate *pQVar2;
  QRegionData *pQVar3;
  
  uVar1 = (a->super_QList<QPoint>).d.size;
  if ((2 < uVar1) &&
     (pQVar2 = PolygonRegion((a->super_QList<QPoint>).d.ptr,(int)uVar1,
                             (uint)(fillRule == WindingFill)), pQVar2 != (QRegionPrivate *)0x0)) {
    pQVar3 = (QRegionData *)operator_new(0x10);
    this->d = pQVar3;
    (pQVar3->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
    this->d->qt_rgn = pQVar2;
    return;
  }
  this->d = &shared_empty;
  return;
}

Assistant:

QRegion::QRegion(const QPolygon &a, Qt::FillRule fillRule)
{
    if (a.size() > 2) {
        QRegionPrivate *qt_rgn = PolygonRegion(a.constData(), a.size(),
                                               fillRule == Qt::WindingFill ? WindingRule : EvenOddRule);
        if (qt_rgn) {
            d =  new QRegionData;
            d->ref.initializeOwned();
            d->qt_rgn = qt_rgn;
        } else {
            d = const_cast<QRegionData*>(&shared_empty);
        }
    } else {
        d = const_cast<QRegionData*>(&shared_empty);
    }
}